

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolderTests.cpp
# Opt level: O2

void __thiscall SOH_containedType_Test::~SOH_containedType_Test(SOH_containedType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SOH, containedType)
{
    SearchableObjectHolder<std::string, char> SOH1;
    EXPECT_TRUE(SOH1.empty());
    SOH1.addObject("test1", std::make_shared<std::string>("test_1"), '1');
    SOH1.addObject("test2", std::make_shared<std::string>("test_2"), '2');
    SOH1.addObject("test3", std::make_shared<std::string>("test_3"), '3');

    auto objects = SOH1.getObjects();
    ASSERT_EQ(objects.size(), 3U);
    EXPECT_EQ(*(objects[0]), "test_1");
    EXPECT_EQ(*(objects[1]), "test_2");
    EXPECT_EQ(*(objects[2]), "test_3");

    EXPECT_TRUE(SOH1.checkObjectType("test1", '1'));

    objects.clear();
}